

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O1

void sexp_insert_timed(sexp_conflict ctx,sexp_conflict thread,sexp_conflict timeout)

{
  timeval *ptVar1;
  sexp_tag_t sVar2;
  long lVar3;
  long lVar4;
  sexp_conflict psVar5;
  long lVar6;
  sexp_conflict psVar7;
  sexp_conflict **pppsVar8;
  sexp_conflict psVar9;
  double __x;
  double dVar10;
  
  sexp_delete_list(ctx,(int)thread,timeout);
  psVar5 = (sexp_conflict)(((ctx->value).type.setters)->value).context.mark_stack[10].end;
  if ((((ulong)timeout & 1) != 0) || ((((ulong)timeout & 2) == 0 && (timeout->tag - 0xb < 3)))) {
    gettimeofday((timeval *)&(thread->value).context.tval,(__timezone_ptr_t)0x0);
  }
  if (((ulong)timeout & 1) != 0) {
    ptVar1 = &(thread->value).context.tval;
    ptVar1->tv_sec = ptVar1->tv_sec + ((long)timeout >> 1);
    goto LAB_00102714;
  }
  if (((ulong)timeout & 2) == 0) {
    sVar2 = timeout->tag;
    if (sVar2 == 0x24) {
      (thread->value).context.tval.tv_sec = (timeout->value).context.tval.tv_sec;
      (thread->value).context.tval.tv_usec = (timeout->value).context.tval.tv_usec;
      goto LAB_00102714;
    }
    if (sVar2 == 0xd) {
      __x = (double)sexp_ratio_to_double(ctx,timeout);
    }
    else {
      if (sVar2 != 0xb) goto LAB_00102707;
      __x = (timeout->value).flonum;
    }
    dVar10 = trunc(__x);
    lVar4 = (long)((double)(thread->value).context.tval.tv_sec + dVar10);
    (thread->value).context.tval.tv_sec = lVar4;
    lVar6 = (long)((__x - dVar10) * 1000000.0 + (double)(thread->value).context.tval.tv_usec);
    (thread->value).context.tval.tv_usec = lVar6;
    if (1000000 < lVar6) {
      (thread->value).context.tval.tv_sec = lVar4 + 1;
      (thread->value).context.tval.tv_usec = lVar6 + -1000000;
    }
  }
  else {
LAB_00102707:
    (thread->value).context.tval.tv_sec = 0;
    (thread->value).context.tval.tv_usec = 0;
  }
LAB_00102714:
  if ((((ulong)timeout & 1) == 0) &&
     (((((ulong)timeout & 2) != 0 || (0x24 < (ulong)timeout->tag)) ||
      ((0x1000003800U >> ((ulong)timeout->tag & 0x3f) & 1) == 0)))) {
    psVar7 = (sexp_conflict)&DAT_0000023e;
    if ((((ulong)psVar5 & 3) == 0) && (psVar9 = psVar5, psVar5->tag == 6)) {
      while (psVar5 = psVar9, *(long *)((long)&((psVar9->value).type.name)->value + 0x6090) != 0) {
        psVar5 = *(sexp_conflict *)((long)&psVar9->value + 8);
        psVar7 = psVar9;
        if ((((ulong)psVar5 & 3) != 0) || (psVar9 = psVar5, psVar5->tag != 6)) break;
      }
    }
  }
  else {
    psVar7 = (sexp_conflict)&DAT_0000023e;
    if ((((ulong)psVar5 & 3) == 0) && (psVar9 = psVar5, psVar5->tag == 6)) {
      while( true ) {
        lVar4 = (long)(psVar9->value).type.name;
        lVar6 = *(long *)(lVar4 + 0x6098);
        psVar5 = psVar9;
        if ((lVar6 == 0) && (*(long *)(lVar4 + 0x60a0) == 0)) break;
        lVar3 = (thread->value).context.tval.tv_sec;
        if ((((lVar3 <= lVar6) &&
             ((lVar6 != lVar3 || ((thread->value).context.tval.tv_usec <= *(long *)(lVar4 + 0x60a0))
              ))) || (psVar5 = *(sexp_conflict *)((long)&psVar9->value + 8), psVar7 = psVar9,
                     ((ulong)psVar5 & 3) != 0)) || (psVar9 = psVar5, psVar5->tag != 6)) break;
      }
    }
  }
  psVar5 = (sexp_conflict)sexp_cons_op(ctx,0,2,thread,psVar5);
  if (psVar7 == (sexp_conflict)&DAT_0000023e) {
    pppsVar8 = &(((ctx->value).type.setters)->value).context.mark_stack[10].end;
  }
  else {
    pppsVar8 = (sexp_conflict **)((long)&psVar7->value + 8);
  }
  *pppsVar8 = (sexp_conflict *)psVar5;
  return;
}

Assistant:

static void sexp_insert_timed (sexp ctx, sexp thread, sexp timeout) {
#if SEXP_USE_FLONUMS
  double d;
#endif
  sexp ls1=SEXP_NULL, ls2;
  sexp_delete_list(ctx, SEXP_G_THREADS_PAUSED, thread);
  ls2 = sexp_global(ctx, SEXP_G_THREADS_PAUSED);
  if (sexp_realp(timeout))
    gettimeofday(&sexp_context_timeval(thread), NULL);
  if (sexp_fixnump(timeout)) {
    sexp_context_timeval(thread).tv_sec += sexp_unbox_fixnum(timeout);
#if SEXP_USE_FLONUMS
  } else if (sexp_flonump(timeout)) {
    d = sexp_flonum_value(timeout);
    sexp_context_timeval(thread).tv_sec += trunc(d);
    sexp_context_timeval(thread).tv_usec += (d-trunc(d))*1000000;
    if (sexp_context_timeval(thread).tv_usec > 1000000) {
      sexp_context_timeval(thread).tv_sec += 1;
      sexp_context_timeval(thread).tv_usec -= 1000000;
    }
#endif
#if SEXP_USE_RATIOS
  } else if (sexp_ratiop(timeout)) {
    d = sexp_ratio_to_double(ctx, timeout);
    sexp_context_timeval(thread).tv_sec += trunc(d);
    sexp_context_timeval(thread).tv_usec += (d-trunc(d))*1000000;
    if (sexp_context_timeval(thread).tv_usec > 1000000) {
      sexp_context_timeval(thread).tv_sec += 1;
      sexp_context_timeval(thread).tv_usec -= 1000000;
    }
#endif
  } else if (sexp_contextp(timeout)) {
    sexp_context_timeval(thread).tv_sec = sexp_context_timeval(timeout).tv_sec;
    sexp_context_timeval(thread).tv_usec = sexp_context_timeval(timeout).tv_usec;
  } else {
    sexp_context_timeval(thread).tv_sec = 0;
    sexp_context_timeval(thread).tv_usec = 0;
  }
  if (sexp_realp(timeout) || sexp_contextp(timeout))
    while (sexp_pairp(ls2)
           && sexp_context_before(sexp_car(ls2), sexp_context_timeval(thread)))
      ls1=ls2, ls2=sexp_cdr(ls2);
  else
    while (sexp_pairp(ls2) && sexp_context_timeval(sexp_car(ls2)).tv_sec)
      ls1=ls2, ls2=sexp_cdr(ls2);
  if (ls1 == SEXP_NULL)
    sexp_global(ctx, SEXP_G_THREADS_PAUSED) = sexp_cons(ctx, thread, ls2);
  else
    sexp_cdr(ls1) = sexp_cons(ctx, thread, ls2);
}